

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFMovecr<(moira::Instr)237,(moira::Mode)0,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  Fp local_44 [2];
  Imu<4> local_3c;
  int local_38;
  Ffmt local_34;
  byte local_2e;
  byte local_2d;
  u32 local_2c;
  u8 ofs;
  u32 uStack_28;
  u8 dst;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)(local_2c >> 7) & 7;
  local_2e = (byte)local_2c & 0x7f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExtFPU(this,FMOVECR,DN,ext._2_2_,local_2c), bVar1)) {
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    Ffmt::Ffmt(&local_34,2);
    pSVar2 = StrWriter::operator<<(pSVar2,local_34);
    local_38 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_38);
    Imu<4>::Imu(&local_3c,(uint)local_2e);
    pSVar2 = StrWriter::operator<<(pSVar2,local_3c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Fp::Fp(local_44,(uint)local_2d);
    StrWriter::operator<<(pSVar2,local_44[0]);
  }
  else {
    *_old = uStack_28;
    dasmIllegal<(moira::Instr)237,(moira::Mode)0,0>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFMovecr(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto dst = ______xxx_______ (ext);
    auto ofs = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Ffmt{2} << str.tab << Imu{ofs} << Sep{} << Fp{dst};
}